

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O2

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab,gpt_params *params)

{
  int32_t *piVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  mapped_type pgVar4;
  pointer pgVar5;
  pointer ppgVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  void *pvVar8;
  FILE *__stream;
  _Alloc_hider _Var9;
  value_type pgVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  long lVar19;
  ggml_context *pgVar20;
  ggml_tensor *pgVar21;
  mapped_type *ppgVar22;
  undefined8 uVar23;
  mapped_type *ppgVar24;
  _Base_ptr p_Var25;
  ggml_backend_buffer_t pgVar26;
  iterator iVar27;
  ulong uVar28;
  iterator iVar29;
  size_type __new_size;
  undefined8 uVar30;
  mapped_type pgVar31;
  pointer pcVar32;
  long lVar33;
  long lVar34;
  int *piVar35;
  int iVar36;
  char *__format;
  int i;
  long lVar37;
  pointer ppgVar38;
  mapped_type pgVar39;
  undefined1 uVar40;
  uint uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int32_t n_vocab;
  uint uStack_364;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  ggml_tensor *pgStack_348;
  mapped_type local_340;
  uint local_338;
  allocator<char> local_331;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
  tensor_backends;
  int32_t length;
  map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
  backend_buffers;
  uint32_t len;
  pointer pcStack_2b0;
  pointer local_2a8;
  int32_t *local_298;
  _Base_ptr local_290;
  int32_t ne [2];
  int32_t ttype;
  int32_t n_dims;
  ggml_backend_t backend;
  ggml_tallocr alloc;
  ifstream fin;
  uint auStack_218 [122];
  
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p);
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  if ((*(byte *)((long)auStack_218 + *(long *)(_fin + -0x18)) & 5) == 0) {
    std::istream::read((char *)&fin,(long)&tensor_backends);
    if (tensor_backends._M_t._M_impl._0_4_ == 0x67676d6c) {
      std::istream::read((char *)&fin,(long)model);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_ctx);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_embd);
      std::istream::read((char *)&fin,(long)&(model->hparams).n_head);
      local_298 = &(model->hparams).n_layer;
      std::istream::read((char *)&fin,(long)local_298);
      piVar1 = &(model->hparams).ftype;
      std::istream::read((char *)&fin,(long)piVar1);
      iVar15 = (model->hparams).ftype;
      printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_vocab);
      printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_ctx);
      printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_embd);
      printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_head);
      printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).n_layer);
      printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(model->hparams).ftype);
      printf("%s: qntvr   = %d\n","gpt2_model_load",(long)iVar15 / 1000 & 0xffffffff);
      (model->hparams).ftype = (model->hparams).ftype % 1000;
      _n_vocab = (pointer)((ulong)uStack_364 << 0x20);
      std::istream::read((char *)&fin,(long)&n_vocab);
      if (n_vocab == (model->hparams).n_vocab) {
        tensor_backends._M_t._M_impl._0_8_ =
             &tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&backend_buffers,0x80,
                   (allocator_type *)&alloc);
        for (alloc.buffer._0_4_ = 0; (int)alloc.buffer < n_vocab;
            alloc.buffer._0_4_ = (int)alloc.buffer + 1) {
          std::istream::read((char *)&fin,(long)&len);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)&backend_buffers,
                     (ulong)_len & 0xffffffff);
          std::istream::read((char *)&fin,backend_buffers._M_t._M_impl._0_8_);
          std::__cxx11::string::assign((char *)&tensor_backends,backend_buffers._M_t._M_impl._0_8_);
          iVar15 = (int)alloc.buffer;
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&vocab->token_to_id,(key_type *)&tensor_backends);
          *pmVar17 = iVar15;
          pmVar18 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&vocab->id_to_token,(key_type *)&alloc);
          std::__cxx11::string::_M_assign((string *)pmVar18);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&backend_buffers);
        std::__cxx11::string::~string((string *)&tensor_backends);
        iVar15 = ggml_ftype_to_ggml_type(*piVar1);
        if (iVar15 == 0x27) {
          uVar40 = 0;
          fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                  (fname->_M_dataplus)._M_p,(ulong)(uint)*piVar1);
        }
        else {
          iVar36 = (model->hparams).n_layer;
          lVar19 = ggml_tensor_overhead();
          lVar19 = lVar19 * ((long)iVar36 * 0xc + 0xb);
          uVar30 = 0;
          pgVar20 = (ggml_context *)ggml_init();
          model->ctx_w = pgVar20;
          if (pgVar20 == (ggml_context *)0x0) {
            uVar40 = 0;
            fprintf(_stderr,"%s: ggml_init() failed\n","gpt2_model_load");
          }
          else {
            iVar36 = (model->hparams).n_embd;
            lVar37 = (long)iVar36;
            uVar3 = (model->hparams).n_layer;
            iVar16 = (model->hparams).n_ctx;
            lVar33 = (long)(model->hparams).n_vocab;
            std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                      (&model->layers,(long)(int)uVar3);
            pgVar21 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar37);
            model->ln_f_g = pgVar21;
            pgVar21 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar37);
            model->ln_f_b = pgVar21;
            pgVar21 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,iVar15,lVar37,lVar33);
            model->wte = pgVar21;
            pgVar21 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,0,lVar37,(long)iVar16);
            model->wpe = pgVar21;
            pgVar21 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx_w,iVar15,lVar37,lVar33);
            model->lm_head = pgVar21;
            pgVar4 = model->ln_f_g;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tensor_backends,"model/ln_f/g",(allocator<char> *)&backend_buffers
                      );
            this = &model->tensors;
            ppgVar22 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&tensor_backends);
            *ppgVar22 = pgVar4;
            std::__cxx11::string::~string((string *)&tensor_backends);
            pgVar4 = model->ln_f_b;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tensor_backends,"model/ln_f/b",(allocator<char> *)&backend_buffers
                      );
            ppgVar22 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&tensor_backends);
            *ppgVar22 = pgVar4;
            std::__cxx11::string::~string((string *)&tensor_backends);
            pgVar4 = model->wte;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tensor_backends,"model/wte",(allocator<char> *)&backend_buffers);
            ppgVar22 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&tensor_backends);
            *ppgVar22 = pgVar4;
            std::__cxx11::string::~string((string *)&tensor_backends);
            pgVar4 = model->wpe;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tensor_backends,"model/wpe",(allocator<char> *)&backend_buffers);
            ppgVar22 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&tensor_backends);
            *ppgVar22 = pgVar4;
            std::__cxx11::string::~string((string *)&tensor_backends);
            pgVar4 = model->lm_head;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tensor_backends,"model/lm_head",
                       (allocator<char> *)&backend_buffers);
            ppgVar22 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[](this,(key_type *)&tensor_backends);
            *ppgVar22 = pgVar4;
            std::__cxx11::string::~string((string *)&tensor_backends);
            local_340 = (mapped_type)(lVar37 * 3);
            lVar33 = (long)(iVar36 * 4);
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            lVar34 = 0x58;
            local_290 = (_Base_ptr)lVar37;
            for (uVar42 = 0; p_Var11 = local_290, uVar3 != uVar42; uVar42 = uVar42 + 1) {
              pgVar5 = (model->layers).super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,local_290);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x58) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,p_Var11);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x50) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,p_Var11);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x48) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,p_Var11);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x40) = uVar23;
              uVar23 = ggml_new_tensor_2d(model->ctx_w,iVar15,p_Var11,local_340);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x38) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,local_340);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x30) = uVar23;
              uVar23 = ggml_new_tensor_2d(model->ctx_w,iVar15,p_Var11,p_Var11);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x28) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,p_Var11);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x20) = uVar23;
              uVar23 = ggml_new_tensor_2d(model->ctx_w,iVar15,p_Var11,lVar33);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x18) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,lVar33);
              *(undefined8 *)((long)pgVar5 + lVar34 + -0x10) = uVar23;
              uVar23 = ggml_new_tensor_2d(model->ctx_w,iVar15,lVar33,p_Var11);
              *(undefined8 *)((long)pgVar5 + lVar34 + -8) = uVar23;
              uVar23 = ggml_new_tensor_1d(model->ctx_w,0,p_Var11);
              *(undefined8 *)((long)&pgVar5->ln_1_g + lVar34) = uVar23;
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x58);
              iVar36 = (int)uVar42;
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/ln_1/g");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x50);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/ln_1/b");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x48);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/ln_2/g");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x40);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/ln_2/b");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x38);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/attn/c_attn/w");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x30);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/attn/c_attn/b");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x28);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/attn/c_proj/w");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x20);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/attn/c_proj/b");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x18);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/mlp/c_fc/w");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -0x10);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/mlp/c_fc/b");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)pgVar5 + lVar34 + -8);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/mlp/c_proj/w");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              pgVar4 = *(mapped_type *)((long)&pgVar5->ln_1_g + lVar34);
              std::__cxx11::to_string((string *)&n_vocab,iVar36);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"model/h",(string *)&n_vocab);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &tensor_backends,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backend_buffers,"/mlp/c_proj/b");
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&tensor_backends);
              *ppgVar22 = pgVar4;
              std::__cxx11::string::~string((string *)&tensor_backends);
              std::__cxx11::string::~string((string *)&backend_buffers);
              std::__cxx11::string::~string((string *)&n_vocab);
              lVar34 = lVar34 + 0x60;
            }
            init_backends(model,params);
            pgVar39 = *(model->backends).
                       super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_340 = (model->backends).
                        super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
            tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header;
            tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffff00000000;
            tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            tensor_backends._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            iVar15 = (model->hparams).n_layer;
            iVar36 = params->n_gpu_layers;
            p_Var2 = &(model->tensors)._M_t._M_impl.super__Rb_tree_header;
            tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 tensor_backends._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var25 = (model->tensors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var25 != p_Var2;
                p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
              ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                      *)&backend_buffers,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                      *)(p_Var25 + 1));
              bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&backend_buffers,"model/wte");
              if ((bVar12) ||
                 (bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&backend_buffers,"model/wpe"), bVar12)) {
                if (*local_298 < params->n_gpu_layers) {
                  ppgVar24 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[](&tensor_backends,(key_type *)&backend_buffers);
                  pgVar31 = pgVar39;
                }
                else {
                  ppgVar24 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[](&tensor_backends,(key_type *)&backend_buffers);
                  pgVar31 = local_340;
                }
                *ppgVar24 = pgVar31;
              }
              bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&backend_buffers,"model/ln_f/g");
              if (((bVar12) ||
                  (bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&backend_buffers,"model/ln_f/b"), bVar12)) ||
                 (bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&backend_buffers,"model/lm_head"), bVar12)) {
                if (params->n_gpu_layers < 1) {
                  ppgVar24 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[](&tensor_backends,(key_type *)&backend_buffers);
                  pgVar31 = local_340;
                }
                else {
                  ppgVar24 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[](&tensor_backends,(key_type *)&backend_buffers);
                  pgVar31 = pgVar39;
                }
                *ppgVar24 = pgVar31;
              }
              std::__cxx11::string::substr((ulong)&n_vocab,(ulong)&backend_buffers);
              bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&n_vocab,"model/h");
              std::__cxx11::string::~string((string *)&n_vocab);
              if (bVar12) {
                std::__cxx11::string::substr((ulong)&n_vocab,(ulong)&backend_buffers);
                iVar16 = std::__cxx11::stoi((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&n_vocab,(size_t *)0x0,10);
                std::__cxx11::string::~string((string *)&n_vocab);
                if (iVar16 < iVar15 - iVar36) {
                  ppgVar24 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[](&tensor_backends,(key_type *)&backend_buffers);
                  pgVar31 = local_340;
                }
                else {
                  ppgVar24 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[](&tensor_backends,(key_type *)&backend_buffers);
                  pgVar31 = pgVar39;
                }
                *ppgVar24 = pgVar31;
              }
              std::__cxx11::string::~string((string *)&backend_buffers);
            }
            backend_buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &backend_buffers._M_t._M_impl.super__Rb_tree_header._M_header;
            backend_buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            backend_buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            backend_buffers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            ppgVar6 = (model->backends).
                      super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            backend_buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 backend_buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            for (ppgVar38 = (model->backends).
                            super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
                            _M_impl.super__Vector_impl_data._M_start; ppgVar38 != ppgVar6;
                ppgVar38 = ppgVar38 + 1) {
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*ppgVar38;
              lVar33 = 0;
              for (p_Var25 = (model->tensors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var25 != p_Var2;
                  p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                        *)&n_vocab,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                        *)(p_Var25 + 1));
                ppgVar24 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                           ::operator[](&tensor_backends,(key_type *)&n_vocab);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*ppgVar24 == paVar7) {
                  lVar37 = ggml_nbytes(pgStack_348);
                  lVar33 = lVar33 + lVar37 + 0x200;
                }
                std::__cxx11::string::~string((string *)&n_vocab);
              }
              if (lVar33 == 0) {
                _n_vocab = (pointer)0x0;
                std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
                emplace_back<ggml_backend_buffer*>
                          ((vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                           &model->buffers_w,(ggml_backend_buffer **)&n_vocab);
              }
              else {
                uVar23 = ggml_backend_name(paVar7);
                auVar43._8_4_ = (int)((ulong)lVar33 >> 0x20);
                auVar43._0_8_ = lVar33;
                auVar43._12_4_ = 0x45300000;
                printf("%s: %8s buffer size = %8.2f MB\n",
                       ((auVar43._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,"gpt2_model_load",uVar23);
                _len = (value_type)ggml_backend_alloc_buffer(paVar7,lVar33);
                ggml_backend_buffer_set_usage(_len,1);
                std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::
                push_back(&model->buffers_w,(value_type *)&len);
                ggml_tallocr_new(&alloc,_len);
                local_360 = CONCAT44(alloc.buffer._4_4_,(int)alloc.buffer);
                aStack_358._8_8_ = alloc.alignment;
                pgStack_348 = (ggml_tensor *)alloc.offset;
                aStack_358._M_allocated_capacity = (size_type)alloc.base;
                _n_vocab = (pointer)paVar7;
                std::
                _Rb_tree<ggml_backend*,std::pair<ggml_backend*const,ggml_tallocr>,std::_Select1st<std::pair<ggml_backend*const,ggml_tallocr>>,std::less<ggml_backend*>,std::allocator<std::pair<ggml_backend*const,ggml_tallocr>>>
                ::_M_emplace_unique<std::pair<ggml_backend*,ggml_tallocr>>
                          ((_Rb_tree<ggml_backend*,std::pair<ggml_backend*const,ggml_tallocr>,std::_Select1st<std::pair<ggml_backend*const,ggml_tallocr>>,std::less<ggml_backend*>,std::allocator<std::pair<ggml_backend*const,ggml_tallocr>>>
                            *)&backend_buffers,(pair<ggml_backend_*,_ggml_tallocr> *)&n_vocab);
              }
            }
            uVar42 = (long)(model->hparams).n_ctx * (long)(model->hparams).n_layer;
            lVar33 = (long)(model->hparams).n_embd * uVar42;
            pgVar21 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar33);
            model->memory_k = pgVar21;
            pgVar21 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx_w,0,lVar33);
            model->memory_v = pgVar21;
            ggml_set_name(model->memory_k,"model/memory_k");
            ggml_set_name(model->memory_v,"model/memory_v");
            lVar33 = ggml_nbytes(model->memory_k);
            lVar37 = ggml_nbytes(model->memory_v);
            lVar37 = lVar37 + lVar33;
            auVar44._8_4_ = (int)((ulong)lVar37 >> 0x20);
            auVar44._0_8_ = lVar37;
            auVar44._12_4_ = 0x45300000;
            printf("%s: memory size = %8.2f MB, n_mem = %d\n",
                   ((auVar44._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar37) - 4503599627370496.0)) * 0.0009765625 *
                   0.0009765625,"gpt2_model_load",uVar42 & 0xffffffff);
            pgVar31 = pgVar39;
            if (params->n_gpu_layers < *local_298 / 2) {
              pgVar31 = local_340;
            }
            uVar23 = ggml_backend_name(pgVar31,2,(long)*local_298 % 2 & 0xffffffff);
            printf("%s: backend_kv = %s\n","gpt2_model_load",uVar23);
            pgVar26 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar31,lVar37 + 0x400);
            model->buffer_kv = pgVar26;
            local_290 = &p_Var2->_M_header;
            ggml_tallocr_new(&n_vocab,pgVar26);
            ggml_tallocr_alloc(&n_vocab,model->memory_k);
            ggml_tallocr_alloc(&n_vocab,model->memory_v);
            local_2a8 = (pointer)0x0;
            _len = (value_type)0x0;
            pcStack_2b0 = (pointer)0x0;
            lVar33 = 0;
            bVar12 = false;
            while( true ) {
              std::istream::read((char *)&fin,(long)&n_dims);
              std::istream::read((char *)&fin,(long)&length);
              std::istream::read((char *)&fin,(long)&ttype);
              uVar3 = *(uint *)((long)auStack_218 + *(long *)(_fin + -0x18));
              uVar41 = (uVar3 & 2) >> 1;
              if (uVar41 != 0) break;
              ne[0] = 1;
              ne[1] = 1;
              piVar35 = ne;
              iVar15 = 1;
              for (lVar37 = 0; lVar37 < n_dims; lVar37 = lVar37 + 1) {
                std::istream::read((char *)&fin,(long)piVar35);
                iVar15 = iVar15 * *piVar35;
                piVar35 = piVar35 + 1;
              }
              _n_vocab = (pointer)&aStack_358;
              std::__cxx11::string::_M_construct((ulong)&n_vocab,(char)length);
              std::istream::read((char *)&fin,(long)_n_vocab);
              iVar27 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::find(&this->_M_t,(key_type *)&n_vocab);
              if (iVar27._M_node == local_290) {
                fprintf(_stderr,"%s: unknown tensor \'%s\' in model file\n","gpt2_model_load",
                        _n_vocab);
LAB_0010a6b5:
                std::__cxx11::string::~string((string *)&n_vocab);
                goto LAB_0010a3bd;
              }
              local_338 = uVar41;
              ppgVar22 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[](this,(key_type *)&n_vocab);
              pgVar4 = *ppgVar22;
              ggml_set_name(pgVar4,_n_vocab);
              lVar37 = ggml_nelements(pgVar4);
              if (lVar37 != iVar15) {
                fprintf(_stderr,"%s: tensor \'%s\' has wrong size in model file\n","gpt2_model_load"
                        ,_n_vocab);
                uVar41 = local_338;
                goto LAB_0010a6b5;
              }
              if ((pgVar4->ne[0] != (long)ne[0]) || (pgVar4->ne[1] != (long)ne[1])) {
                fprintf(_stderr,
                        "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                        ,"gpt2_model_load",_n_vocab,pgVar4->ne[0],pgVar4->ne[1],
                        CONCAT44((int)((ulong)lVar19 >> 0x20),ne[0]),
                        CONCAT44((int)((ulong)uVar30 >> 0x20),ne[1]));
                uVar41 = local_338;
                goto LAB_0010a6b5;
              }
              lVar34 = ggml_type_size(ttype);
              uVar42 = ggml_blck_size(pgVar4->type);
              uVar28 = ggml_nbytes(pgVar4);
              _Var9._M_p = _n_vocab;
              __stream = _stderr;
              if ((ulong)(lVar34 * lVar37) / uVar42 != uVar28) {
                uVar30 = ggml_nbytes(pgVar4);
                fprintf(__stream,
                        "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                        "gpt2_model_load",_Var9._M_p,uVar30,lVar34 * lVar37);
                uVar41 = local_338;
                goto LAB_0010a6b5;
              }
              ppgVar24 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                         ::operator[](&tensor_backends,(key_type *)&n_vocab);
              backend = *ppgVar24;
              iVar29 = std::
                       _Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                       ::find(&backend_buffers._M_t,&backend);
              ggml_tallocr_alloc(&iVar29._M_node[1]._M_parent,pgVar4);
              cVar13 = ggml_backend_is_cpu(backend);
              if (cVar13 == '\0') {
                __new_size = ggml_nbytes(pgVar4);
                std::vector<char,_std::allocator<char>_>::resize
                          ((vector<char,_std::allocator<char>_> *)&len,__new_size);
                pgVar10 = _len;
                ggml_nbytes(pgVar4);
                std::istream::read((char *)&fin,(long)pgVar10);
                pgVar10 = _len;
                uVar23 = ggml_nbytes(pgVar4);
                ggml_backend_tensor_set(pgVar4,pgVar10,0,uVar23);
              }
              else {
                pvVar8 = pgVar4->data;
                ggml_nbytes(pgVar4);
                std::istream::read((char *)&fin,(long)pvVar8);
              }
              bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&n_vocab,"model/wte");
              if ((bVar14) && (!bVar12)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&alloc,"model/lm_head",&local_331);
                ppgVar24 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                           ::operator[](&tensor_backends,(key_type *)&alloc);
                iVar29 = std::
                         _Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                         ::find(&backend_buffers._M_t,ppgVar24);
                std::__cxx11::string::~string((string *)&alloc);
                ggml_tallocr_alloc(&iVar29._M_node[1]._M_parent,model->lm_head);
                ggml_backend_tensor_copy(pgVar4,model->lm_head);
                lVar37 = ggml_nbytes(model->lm_head);
                lVar33 = lVar33 + lVar37;
              }
              bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&n_vocab,"model/lm_head");
              lVar37 = ggml_nbytes(pgVar4);
              if (bVar14) {
                bVar12 = true;
              }
              lVar33 = lVar33 + lVar37;
              std::__cxx11::string::~string((string *)&n_vocab);
            }
            auVar45._8_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar45._0_8_ = lVar33;
            auVar45._12_4_ = 0x45300000;
            printf("%s: model size  = %8.2f MB\n",
                   ((auVar45._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0)) * 0.0009765625 *
                   0.0009765625,"gpt2_model_load");
LAB_0010a3bd:
            uVar40 = (undefined1)uVar41;
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)&len);
            if ((uVar3 & 2) != 0) {
              std::ifstream::close();
              pgVar21 = (ggml_tensor *)
                        ggml_new_tensor_1d(model->ctx_w,0x1a,(long)(model->hparams).n_ctx);
              model->embd = pgVar21;
              pgVar21 = (ggml_tensor *)
                        ggml_new_tensor_1d(model->ctx_w,0x1a,(long)(model->hparams).n_ctx);
              model->position = pgVar21;
              ggml_set_name(model->embd,"in/embd");
              ggml_set_name(model->position,"in/position");
              lVar19 = ggml_nbytes(model->embd);
              lVar33 = ggml_nbytes(model->position);
              if (params->n_gpu_layers < *local_298) {
                pgVar39 = local_340;
              }
              pgVar26 = (ggml_backend_buffer_t)
                        ggml_backend_alloc_buffer(pgVar39,lVar33 + lVar19 + 0x600);
              model->buffer_input = pgVar26;
              uVar30 = ggml_backend_name(pgVar39);
              printf("%s: backend_in = %s (%zu bytes)\n","gpt2_model_load",uVar30,lVar33 + lVar19);
              ggml_tallocr_new(&n_vocab,model->buffer_input);
              ggml_tallocr_alloc(&n_vocab,model->embd);
              ggml_tallocr_alloc(&n_vocab,model->position);
            }
            std::
            _Rb_tree<ggml_backend_*,_std::pair<ggml_backend_*const,_ggml_tallocr>,_std::_Select1st<std::pair<ggml_backend_*const,_ggml_tallocr>_>,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
            ::~_Rb_tree(&backend_buffers._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
            ::~_Rb_tree(&tensor_backends._M_t);
          }
        }
      }
      else {
        uVar40 = 0;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n",
                "gpt2_model_load",(fname->_M_dataplus)._M_p);
      }
      goto LAB_0010a506;
    }
    pcVar32 = (fname->_M_dataplus)._M_p;
    __format = "%s: invalid model file \'%s\' (bad magic)\n";
  }
  else {
    pcVar32 = (fname->_M_dataplus)._M_p;
    __format = "%s: failed to open \'%s\'\n";
  }
  uVar40 = 0;
  fprintf(_stderr,__format,"gpt2_model_load",pcVar32);
LAB_0010a506:
  std::ifstream::~ifstream(&fin);
  return (bool)uVar40;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab, const gpt_params & params) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    // create the ggml context
    {
        size_t n_tensors = 3 /* input */ + 2 /* kv */ + 6 + 12*model.hparams.n_layer;
        struct ggml_init_params params = {
            /*.mem_size   =*/ ggml_tensor_overhead() * n_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // create tensors for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // assign tensors to backends
    init_backends(model, params);
    ggml_backend_t backend_gpu = model.backends.front();
    ggml_backend_t backend_cpu = model.backends.back();
    std::map<std::string, ggml_backend_t> tensor_backends;
    {
        const int i_gpu_first_layer = model.hparams.n_layer - params.n_gpu_layers;
        for (auto it : model.tensors) {
            const std::string & name = it.first;
            // input tensors
            if (name == "model/wte" || name == "model/wpe") {
                if (params.n_gpu_layers > model.hparams.n_layer) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
            // output tensors
            if (name == "model/ln_f/g" || name == "model/ln_f/b" || name == "model/lm_head") {
                if (params.n_gpu_layers > 0) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
            // layer tensors
            if (name.substr(0, 7) == "model/h") {
                // parse layer number
                int layer = std::stoi(name.substr(7, 2));
                if (layer >= i_gpu_first_layer) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
        }
    }

    // allocate buffers
    std::map<ggml_backend_t, ggml_tallocr> backend_buffers;
    for (auto backend : model.backends) {
        // compute the size of the buffer
        size_t size = 0;
        for (auto it : model.tensors) {
            if (tensor_backends[it.first] == backend) {
                size += ggml_nbytes(it.second) + 512;
            }
        }
        if (size > 0) {
            printf("%s: %8s buffer size = %8.2f MB\n", __func__, ggml_backend_name(backend), size/1024.0/1024.0);
            // allocate the buffer
            ggml_backend_buffer_t buffer = ggml_backend_alloc_buffer(backend, size);
            ggml_backend_buffer_set_usage(buffer, GGML_BACKEND_BUFFER_USAGE_WEIGHTS);
            model.buffers_w.push_back(buffer);

            // create an allocator for the buffer to allocate the tensors
            auto alloc = ggml_tallocr_new(buffer);
            backend_buffers.insert(std::make_pair(backend, std::move(alloc)));
        } else {
            model.buffers_w.push_back(NULL);
        }
    }

    // allocate key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        ggml_set_name(model.memory_k, "model/memory_k");
        ggml_set_name(model.memory_v, "model/memory_v");

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);

        // create a backend buffer (can be in host or device memory)
        ggml_backend_t backend_kv = params.n_gpu_layers >= hparams.n_layer/2 ? backend_gpu : backend_cpu;
        printf("%s: backend_kv = %s\n", __func__, ggml_backend_name(backend_kv));
        model.buffer_kv = ggml_backend_alloc_buffer(backend_kv, memory_size + 512*2);

        // allocate the tensors into the backend buffer
        {
            ggml_tallocr alloc = ggml_tallocr_new(model.buffer_kv);

            // this updates the pointers in the tensors to point to the correct location in the buffer
            // this is necessary since the ggml_context is .no_alloc == true
            // note that the buffer can actually be a device buffer, depending on the backend
            ggml_tallocr_alloc(&alloc, model.memory_k);
            ggml_tallocr_alloc(&alloc, model.memory_v);
        }
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        std::vector<char> read_buf;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            ggml_set_name(tensor, name.c_str());
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            // allocate the tensor
            ggml_backend_t backend = tensor_backends[name];
            ggml_tallocr * alloc = &backend_buffers.find(backend)->second;
            ggml_tallocr_alloc(alloc, tensor);
            //printf("%s: [%5.5s] %s\n", __func__, ggml_backend_name(backend), name.c_str());

            if (ggml_backend_is_cpu(backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(backend)
#endif
                ) {
                // for the CPU and Metal backend, we can read directly into the tensor
                fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
            } else {
                // read into a temporary buffer first, then copy to device memory
                read_buf.resize(ggml_nbytes(tensor));
                fin.read(read_buf.data(), ggml_nbytes(tensor));
                ggml_backend_tensor_set(tensor, read_buf.data(), 0, ggml_nbytes(tensor));
            }

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                ggml_tallocr * alloc_head = &backend_buffers.find(tensor_backends["model/lm_head"])->second;
                ggml_tallocr_alloc(alloc_head, model.lm_head);
                //printf("%s: [%5.5s] %s (copied)\n", __func__, ggml_backend_name(tensor_backends["model/lm_head"]), "model/lm_head");
                ggml_backend_tensor_copy(tensor, model.lm_head);
                total_size += ggml_nbytes(model.lm_head);
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }
        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    // allocate input tensors
    {
        model.embd = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, model.hparams.n_ctx);
        model.position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, model.hparams.n_ctx);

        ggml_set_name(model.embd, "in/embd");
        ggml_set_name(model.position, "in/position");

        // add input tensors to cpu backend
        size_t input_size = ggml_nbytes(model.embd) + ggml_nbytes(model.position);

        // FIXME: use cpu backend after sched impl
        ggml_backend_t backend_input = params.n_gpu_layers >= model.hparams.n_layer ? backend_gpu : backend_cpu;
        model.buffer_input = ggml_backend_alloc_buffer(backend_input, input_size + 512*3);
        printf("%s: backend_in = %s (%zu bytes)\n", __func__, ggml_backend_name(backend_input), input_size);

        // allocate the tensors into the backend buffer
        ggml_tallocr alloc = ggml_tallocr_new(model.buffer_input);
        ggml_tallocr_alloc(&alloc, model.embd);
        ggml_tallocr_alloc(&alloc, model.position);
    }

    return true;
}